

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::UpdateTransformState(Element *this)

{
  Vector2f VVar1;
  Vector2f VVar2;
  byte bVar3;
  float fVar4;
  bool bVar5;
  int iVar6;
  ComputedValues *this_00;
  Box *this_01;
  PerspectiveOrigin PVar7;
  pointer pTVar8;
  ThisType *other;
  element_type *peVar9;
  TransformPrimitive *p;
  size_type sVar10;
  reference this_02;
  pointer this_03;
  Matrix4f *pMVar11;
  Vector3<float> VVar12;
  bool local_3d1;
  bool local_3bd;
  ulong local_3b0;
  size_t i_1;
  ThisType local_3a0;
  Matrix4<float,Rml::ColumnMajorStorage<float>> *local_360;
  Matrix4f *parent_transform;
  Matrix4<float,Rml::ColumnMajorStorage<float>> *local_318;
  Matrix4f *parent_perspective;
  TransformState *parent_state;
  float local_300;
  TransformState *local_2f8;
  float local_2f0;
  ThisType local_2ec;
  Matrix4<float,Rml::ColumnMajorStorage<float>> local_2ac [64];
  ThisType local_26c;
  ThisType local_22c;
  TransformOrigin local_1ec;
  TransformOrigin local_1e4;
  TransformOrigin local_1dc;
  TransformOrigin local_1d4;
  TransformOrigin local_1cc;
  TransformOrigin local_1c4;
  undefined1 local_1ac [8];
  Vector3f transform_origin;
  Matrix4f matrix;
  TransformPrimitive *primitive;
  int i;
  int n;
  TransformPtr transform_ptr;
  Matrix4f transform;
  bool have_transform;
  bool had_transform;
  Vector4<float> local_ec;
  Vector4<float> local_dc;
  Vector4<float> local_cc;
  Vector4<float> local_bc;
  undefined1 local_ac [8];
  Matrix4f perspective;
  Colourb CStack_60;
  Type local_5c;
  float fStack_50;
  float fStack_48;
  Type local_44;
  float local_38;
  float fStack_34;
  bool have_perspective;
  Vector2f vanish;
  float distance;
  bool had_perspective;
  float fStack_24;
  bool perspective_or_transform_changed;
  Vector2f size;
  Vector2f pos;
  ComputedValues *computed;
  Element *this_local;
  
  if ((((byte)this->field_0x17 >> 6 & 1) != 0) || (((byte)this->field_0x17 >> 5 & 1) != 0)) {
    this_00 = &this->meta->computed_values;
    VVar1 = GetAbsoluteOffset(this,Border);
    this_01 = GetBox(this);
    VVar2 = Box::GetSize(this_01,Border);
    vanish.y._3_1_ = false;
    distance = VVar2.x;
    fStack_24 = VVar2.y;
    size.x = VVar1.x;
    size.y = VVar1.y;
    if (((byte)this->field_0x17 >> 6 & 1) != 0) {
      bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
      local_3bd = false;
      if (bVar5) {
        pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
                 operator->(&this->transform_state);
        pMVar11 = TransformState::GetLocalPerspective(pTVar8);
        local_3bd = pMVar11 != (Matrix4f *)0x0;
      }
      vanish.y._2_1_ = local_3bd;
      vanish.x = Style::ComputedValues::perspective(this_00);
      Vector2<float>::Vector2
                ((Vector2<float> *)&stack0xffffffffffffffc8,distance * 0.5 + size.x,
                 fStack_24 * 0.5 + size.y);
      bVar3 = 0;
      if (0.0 < vanish.x) {
        bVar3 = 1;
        PVar7 = Style::ComputedValues::perspective_origin_x(this_00);
        local_44 = PVar7.type;
        if (local_44 == Percentage) {
          PVar7 = Style::ComputedValues::perspective_origin_x(this_00);
          fStack_48 = PVar7.value;
          fStack_50 = fStack_48 * 0.01 * distance;
        }
        else {
          PVar7 = Style::ComputedValues::perspective_origin_x(this_00);
          fStack_50 = PVar7.value;
        }
        local_38 = fStack_50 + size.x;
        PVar7 = Style::ComputedValues::perspective_origin_y(this_00);
        local_5c = PVar7.type;
        if (local_5c == Percentage) {
          PVar7 = Style::ComputedValues::perspective_origin_y(this_00);
          CStack_60 = (Colourb)PVar7.value;
          fStack_34 = (float)CStack_60 * 0.01 * fStack_24;
        }
        else {
          perspective.vectors[3]._8_8_ = Style::ComputedValues::perspective_origin_y(this_00);
          fStack_34 = perspective.vectors[3].w;
        }
        fStack_34 = fStack_34 + size.y;
      }
      if (bVar3 == 0) {
        bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
        if (bVar5) {
          pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                   ::operator->(&this->transform_state);
          TransformState::SetLocalPerspective(pTVar8,(Matrix4f *)0x0);
        }
      }
      else {
        Vector4<float>::Vector4(&local_bc,1.0,0.0,-local_38 / vanish.x,0.0);
        Vector4<float>::Vector4(&local_cc,0.0,1.0,-fStack_34 / vanish.x,0.0);
        Vector4<float>::Vector4(&local_dc,0.0,0.0,1.0,0.0);
        Vector4<float>::Vector4(&local_ec,0.0,0.0,-1.0 / vanish.x,1.0);
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::FromRows
                  ((ThisType *)local_ac,&local_bc,&local_cc,&local_dc,&local_ec);
        bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
        if (!bVar5) {
          MakeUnique<Rml::TransformState>();
          ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
          operator=(&this->transform_state,
                    (unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                    &transform.vectors[3].w);
          ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
          ~unique_ptr((unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                      &transform.vectors[3].w);
        }
        pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
                 operator->(&this->transform_state);
        bVar5 = TransformState::SetLocalPerspective(pTVar8,(Matrix4f *)local_ac);
        vanish.y._3_1_ = (vanish.y._3_1_ & 1) != 0 || bVar5;
      }
      vanish.y._3_1_ = (vanish.y._3_1_ & 1) != 0 || bVar3 != (vanish.y._2_1_ & 1);
      this->field_0x17 = this->field_0x17 & 0xbf;
    }
    if (((byte)this->field_0x17 >> 5 & 1) != 0) {
      bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
      local_3d1 = false;
      if (bVar5) {
        pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
                 operator->(&this->transform_state);
        pMVar11 = TransformState::GetTransform(pTVar8);
        local_3d1 = pMVar11 != (Matrix4f *)0x0;
      }
      transform.vectors[3].z._3_1_ = local_3d1;
      transform.vectors[3].z._2_1_ = 0;
      other = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity();
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Matrix4
                ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                 ((long)&transform_ptr.
                         super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4),other);
      Style::ComputedValues::transform((ComputedValues *)&i);
      bVar5 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&i);
      if (bVar5) {
        peVar9 = ::std::
                 __shared_ptr_access<Rml::Transform,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Rml::Transform,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&i);
        iVar6 = Transform::GetNumPrimitives(peVar9);
        for (primitive._0_4_ = 0; (int)primitive < iVar6; primitive._0_4_ = (int)primitive + 1) {
          peVar9 = ::std::
                   __shared_ptr_access<Rml::Transform,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Rml::Transform,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&i);
          p = Transform::GetPrimitive(peVar9,(int)primitive);
          TransformUtilities::ResolveTransform((Matrix4f *)&transform_origin.y,p,this);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*=
                    ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4),(ThisType *)&transform_origin.y);
          transform.vectors[3].z._2_1_ = 1;
        }
        if ((transform.vectors[3].z._2_1_ & 1) != 0) {
          Vector3<float>::Vector3
                    ((Vector3<float> *)local_1ac,distance * 0.5 + size.x,fStack_24 * 0.5 + size.y,
                     0.0);
          local_1c4 = Style::ComputedValues::transform_origin_x(this_00);
          if (local_1c4.type == Percentage) {
            local_1cc = Style::ComputedValues::transform_origin_x(this_00);
            fVar4 = local_1cc.value * distance * 0.01;
          }
          else {
            local_1d4 = Style::ComputedValues::transform_origin_x(this_00);
            fVar4 = local_1d4.value;
          }
          local_1ac._0_4_ = fVar4 + size.x;
          local_1dc = Style::ComputedValues::transform_origin_y(this_00);
          if (local_1dc.type == Percentage) {
            local_1e4 = Style::ComputedValues::transform_origin_y(this_00);
            fVar4 = local_1e4.value * fStack_24 * 0.01;
          }
          else {
            local_1ec = Style::ComputedValues::transform_origin_y(this_00);
            fVar4 = local_1ec.value;
          }
          local_1ac._4_4_ = fVar4 + size.y;
          transform_origin.x = Style::ComputedValues::transform_origin_z(this_00);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Translate
                    ((ThisType *)local_2ac,(Vector3<float> *)local_1ac);
          Matrix4<float,Rml::ColumnMajorStorage<float>>::operator*
                    (&local_26c,local_2ac,
                     (Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
          VVar12 = Vector3<float>::operator-((Vector3<float> *)local_1ac);
          local_300 = VVar12.z;
          parent_state = VVar12._0_8_;
          local_2f8 = parent_state;
          local_2f0 = local_300;
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Translate
                    (&local_2ec,(Vector3<float> *)&local_2f8);
          Matrix4<float,Rml::ColumnMajorStorage<float>>::operator*
                    (&local_22c,(Matrix4<float,Rml::ColumnMajorStorage<float>> *)&local_26c,
                     &local_2ec);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=
                    ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4),&local_22c);
        }
      }
      ::std::shared_ptr<Rml::Transform>::~shared_ptr((shared_ptr<Rml::Transform> *)&i);
      if ((this->parent != (Element *)0x0) &&
         (bVar5 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->parent->transform_state), bVar5)) {
        parent_perspective =
             (Matrix4f *)
             ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
             operator*(&this->parent->transform_state);
        local_318 = (Matrix4<float,Rml::ColumnMajorStorage<float>> *)
                    TransformState::GetLocalPerspective((TransformState *)parent_perspective);
        if (local_318 != (Matrix4<float,Rml::ColumnMajorStorage<float>> *)0x0) {
          Matrix4<float,Rml::ColumnMajorStorage<float>>::operator*
                    ((ThisType *)&parent_transform,local_318,
                     (Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=
                    ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4),(ThisType *)&parent_transform);
          transform.vectors[3].z._2_1_ = 1;
        }
        local_360 = (Matrix4<float,Rml::ColumnMajorStorage<float>> *)
                    TransformState::GetTransform((TransformState *)parent_perspective);
        if (local_360 != (Matrix4<float,Rml::ColumnMajorStorage<float>> *)0x0) {
          Matrix4<float,Rml::ColumnMajorStorage<float>>::operator*
                    (&local_3a0,local_360,
                     (Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator=
                    ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)
                     ((long)&transform_ptr.
                             super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4),&local_3a0);
          transform.vectors[3].z._2_1_ = 1;
        }
      }
      if ((transform.vectors[3].z._2_1_ & 1) == 0) {
        bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
        if (bVar5) {
          pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                   ::operator->(&this->transform_state);
          TransformState::SetTransform(pTVar8,(Matrix4f *)0x0);
        }
      }
      else {
        bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
        if (!bVar5) {
          MakeUnique<Rml::TransformState>();
          ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
          operator=(&this->transform_state,
                    (unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                    &i_1);
          ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
          ~unique_ptr((unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_> *)
                      &i_1);
        }
        pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
                 operator->(&this->transform_state);
        bVar5 = TransformState::SetTransform
                          (pTVar8,(Matrix4f *)
                                  ((long)&transform_ptr.
                                          super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 4));
        vanish.y._3_1_ = (vanish.y._3_1_ & 1) != 0 || bVar5;
      }
      vanish.y._3_1_ =
           (vanish.y._3_1_ & 1) != 0 ||
           (transform.vectors[3].z._3_1_ & 1) != (transform.vectors[3].z._2_1_ & 1);
    }
    if ((bool)vanish.y._3_1_ != false) {
      for (local_3b0 = 0;
          sVar10 = ::std::
                   vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                   ::size(&this->children), local_3b0 < sVar10; local_3b0 = local_3b0 + 1) {
        this_02 = ::std::
                  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ::operator[](&this->children,local_3b0);
        this_03 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_02)
        ;
        DirtyTransformState(this_03,false,true);
      }
    }
    bVar5 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
    if (bVar5) {
      pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
               operator->(&this->transform_state);
      pMVar11 = TransformState::GetTransform(pTVar8);
      if (pMVar11 == (Matrix4f *)0x0) {
        pTVar8 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
                 operator->(&this->transform_state);
        pMVar11 = TransformState::GetLocalPerspective(pTVar8);
        if (pMVar11 == (Matrix4f *)0x0) {
          ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::reset
                    (&this->transform_state,(pointer)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

void Element::UpdateTransformState()
{
	if (!dirty_perspective && !dirty_transform)
		return;

	const ComputedValues& computed = meta->computed_values;

	const Vector2f pos = GetAbsoluteOffset(BoxArea::Border);
	const Vector2f size = GetBox().GetSize(BoxArea::Border);

	bool perspective_or_transform_changed = false;

	if (dirty_perspective)
	{
		// If perspective is set on this element, then it applies to our children. We just calculate it here,
		// and let the children's transform update merge it with their transform.
		bool had_perspective = (transform_state && transform_state->GetLocalPerspective());

		float distance = computed.perspective();
		Vector2f vanish = Vector2f(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f);
		bool have_perspective = false;

		if (distance > 0.0f)
		{
			have_perspective = true;

			// Compute the vanishing point from the perspective origin
			if (computed.perspective_origin_x().type == Style::PerspectiveOrigin::Percentage)
				vanish.x = pos.x + computed.perspective_origin_x().value * 0.01f * size.x;
			else
				vanish.x = pos.x + computed.perspective_origin_x().value;

			if (computed.perspective_origin_y().type == Style::PerspectiveOrigin::Percentage)
				vanish.y = pos.y + computed.perspective_origin_y().value * 0.01f * size.y;
			else
				vanish.y = pos.y + computed.perspective_origin_y().value;
		}

		if (have_perspective)
		{
			// Equivalent to: Translate(x,y,0) * Perspective(distance) * Translate(-x,-y,0)
			Matrix4f perspective = Matrix4f::FromRows( //
				{1, 0, -vanish.x / distance, 0},       //
				{0, 1, -vanish.y / distance, 0},       //
				{0, 0, 1, 0},                          //
				{0, 0, -1 / distance, 1}               //
			);

			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetLocalPerspective(&perspective);
		}
		else if (transform_state)
			transform_state->SetLocalPerspective(nullptr);

		perspective_or_transform_changed |= (have_perspective != had_perspective);

		dirty_perspective = false;
	}

	if (dirty_transform)
	{
		// We want to find the accumulated transform given all our ancestors. It is assumed here that the parent transform is already updated,
		// so that we only need to consider our local transform and combine it with our parent's transform and perspective matrices.
		bool had_transform = (transform_state && transform_state->GetTransform());

		bool have_transform = false;
		Matrix4f transform = Matrix4f::Identity();

		if (TransformPtr transform_ptr = computed.transform())
		{
			// First find the current element's transform
			const int n = transform_ptr->GetNumPrimitives();
			for (int i = 0; i < n; ++i)
			{
				const TransformPrimitive& primitive = transform_ptr->GetPrimitive(i);
				Matrix4f matrix = TransformUtilities::ResolveTransform(primitive, *this);
				transform *= matrix;
				have_transform = true;
			}

			if (have_transform)
			{
				// Compute the transform origin
				Vector3f transform_origin(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f, 0);

				if (computed.transform_origin_x().type == Style::TransformOrigin::Percentage)
					transform_origin.x = pos.x + computed.transform_origin_x().value * size.x * 0.01f;
				else
					transform_origin.x = pos.x + computed.transform_origin_x().value;

				if (computed.transform_origin_y().type == Style::TransformOrigin::Percentage)
					transform_origin.y = pos.y + computed.transform_origin_y().value * size.y * 0.01f;
				else
					transform_origin.y = pos.y + computed.transform_origin_y().value;

				transform_origin.z = computed.transform_origin_z();

				// Make the transformation apply relative to the transform origin
				transform = Matrix4f::Translate(transform_origin) * transform * Matrix4f::Translate(-transform_origin);
			}

			// We may want to include the local offsets here, as suggested by the CSS specs, so that the local transform is applied after the offset I
			// believe the motivation is. Then we would need to subtract the absolute zero-offsets during geometry submit whenever we have transforms.
		}

		if (parent && parent->transform_state)
		{
			// Apply the parent's local perspective and transform.
			// @performance: If we have no local transform and no parent perspective, we can effectively just point to the parent transform instead of
			// copying it.
			const TransformState& parent_state = *parent->transform_state;

			if (auto parent_perspective = parent_state.GetLocalPerspective())
			{
				transform = *parent_perspective * transform;
				have_transform = true;
			}

			if (auto parent_transform = parent_state.GetTransform())
			{
				transform = *parent_transform * transform;
				have_transform = true;
			}
		}

		if (have_transform)
		{
			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetTransform(&transform);
		}
		else if (transform_state)
			transform_state->SetTransform(nullptr);

		perspective_or_transform_changed |= (had_transform != have_transform);
	}

	// A change in perspective or transform will require an update to children transforms as well.
	if (perspective_or_transform_changed)
	{
		for (size_t i = 0; i < children.size(); i++)
			children[i]->DirtyTransformState(false, true);
	}

	// No reason to keep the transform state around if transform and perspective have been removed.
	if (transform_state && !transform_state->GetTransform() && !transform_state->GetLocalPerspective())
	{
		transform_state.reset();
	}
}